

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void anon_unknown.dwarf_23dc62::check(istream *is,char *c,int n)

{
  ostream *poVar1;
  int in_EDX;
  long in_RSI;
  int i_2;
  int i_1;
  int i;
  char v [1024];
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  int iVar2;
  char local_418 [1028];
  int local_14;
  long local_10;
  
  if (0x400 < in_EDX) {
    __assert_fail("n <= (int) sizeof (v)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                  ,0x7d,"void (anonymous namespace)::check(istream &, const char *, int)");
  }
  local_14 = in_EDX;
  local_10 = in_RSI;
  Imf_3_2::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
            ((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
  poVar1 = std::operator<<((ostream *)&std::cout,"char[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  std::operator<<(poVar1,"]: expected \"");
  for (iVar2 = 0; iVar2 < local_14; iVar2 = iVar2 + 1) {
    std::operator<<((ostream *)&std::cout,*(char *)(local_10 + iVar2));
  }
  std::operator<<((ostream *)&std::cout,"\", got \"");
  for (iVar2 = 0; iVar2 < local_14; iVar2 = iVar2 + 1) {
    std::operator<<((ostream *)&std::cout,local_418[iVar2]);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"\"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  iVar2 = 0;
  while( true ) {
    if (local_14 <= iVar2) {
      return;
    }
    if (*(char *)(local_10 + iVar2) != local_418[iVar2]) break;
    iVar2 = iVar2 + 1;
  }
  __assert_fail("c[i] == v[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,0x8e,"void (anonymous namespace)::check(istream &, const char *, int)");
}

Assistant:

void
check (istream& is, const char c[/*n*/], int n)
{
    char v[1024];

    assert (n <= (int) sizeof (v));

    Xdr::read<CharIO> (is, v, n);

    cout << "char[" << n << "]: expected \"";

    for (int i = 0; i < n; i++)
        cout << c[i];

    cout << "\", got \"";

    for (int i = 0; i < n; i++)
        cout << v[i];

    cout << "\"" << endl;

    for (int i = 0; i < n; i++)
        assert (c[i] == v[i]);
}